

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jzon.cpp
# Opt level: O1

int __thiscall Jzon::Node::remove(Node *this,char *__filename)

{
  Data *pDVar1;
  pointer ppVar2;
  void *__s2;
  size_t sVar3;
  size_t __n;
  uint uVar4;
  Data *extraout_RAX;
  iterator iVar6;
  Data *pDVar5;
  
  pDVar5 = this->data;
  if ((pDVar5 != (Data *)0x0) && (pDVar5->type == T_OBJECT)) {
    detach(this);
    pDVar1 = this->data;
    iVar6._M_current =
         (pDVar1->children).
         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jzon::Node>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jzon::Node>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    ppVar2 = (pDVar1->children).
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jzon::Node>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jzon::Node>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pDVar5 = extraout_RAX;
    if (iVar6._M_current != ppVar2) {
      __s2 = *(void **)__filename;
      sVar3 = *(size_t *)(__filename + 8);
      do {
        __n = ((iVar6._M_current)->first)._M_string_length;
        if (__n == sVar3) {
          if (__n == 0) {
LAB_001852ff:
            iVar6 = std::
                    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jzon::Node>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jzon::Node>_>_>
                    ::_M_erase(&pDVar1->children,iVar6);
            return (int)iVar6._M_current;
          }
          uVar4 = bcmp(((iVar6._M_current)->first)._M_dataplus._M_p,__s2,__n);
          pDVar5 = (Data *)(ulong)uVar4;
          if (uVar4 == 0) goto LAB_001852ff;
        }
        iVar6._M_current = iVar6._M_current + 1;
      } while (iVar6._M_current != ppVar2);
    }
  }
  return (int)pDVar5;
}

Assistant:

void Node::remove(const std::string &name)
	{
		if (isObject())
		{
			detach();
			NamedNodeList &children = data->children;
			for (NamedNodeList::iterator it = children.begin(); it != children.end(); ++it)
			{
				if ((*it).first == name)
				{
					children.erase(it);
					break;
				}
			}
		}
	}